

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::resize_file(path *p,uintmax_t size,error_code *ec)

{
  int iVar1;
  value_type *__file;
  error_code eVar2;
  undefined4 uStack_2c;
  error_code *ec_local;
  uintmax_t size_local;
  path *p_local;
  
  std::error_code::clear(ec);
  __file = path::c_str(p);
  iVar1 = truncate(__file,size);
  if (iVar1 != 0) {
    eVar2 = detail::make_system_error(0);
    *(ulong *)ec = CONCAT44(uStack_2c,eVar2._M_value);
    ec->_M_cat = eVar2._M_cat;
  }
  return;
}

Assistant:

GHC_INLINE void resize_file(const path& p, uintmax_t size, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    LARGE_INTEGER lisize;
    lisize.QuadPart = static_cast<LONGLONG>(size);
    if(lisize.QuadPart < 0) {
#ifdef ERROR_FILE_TOO_LARGE
        ec = detail::make_system_error(ERROR_FILE_TOO_LARGE);
#else
        ec = detail::make_system_error(223);
#endif
        return;
    }
    std::shared_ptr<void> file(CreateFileW(detail::fromUtf8<std::wstring>(p.u8string()).c_str(), GENERIC_WRITE, 0, NULL, OPEN_EXISTING, 0, NULL), CloseHandle);
    if (file.get() == INVALID_HANDLE_VALUE) {
        ec = detail::make_system_error();
    }
    else if (SetFilePointerEx(file.get(), lisize, NULL, FILE_BEGIN) == 0 || SetEndOfFile(file.get()) == 0) {
        ec = detail::make_system_error();
    }
#else
    if (::truncate(p.c_str(), static_cast<off_t>(size)) != 0) {
        ec = detail::make_system_error();
    }
#endif
}